

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Order.h
# Opt level: O1

void __thiscall
Order::Order(Order *this,string *clientId,string *symbol,string *owner,string *target,Side side,
            Type type,double price,long quantity)

{
  pointer pcVar1;
  
  (this->m_clientId)._M_dataplus._M_p = (pointer)&(this->m_clientId).field_2;
  pcVar1 = (clientId->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + clientId->_M_string_length);
  (this->m_symbol)._M_dataplus._M_p = (pointer)&(this->m_symbol).field_2;
  pcVar1 = (symbol->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_symbol,pcVar1,pcVar1 + symbol->_M_string_length);
  (this->m_owner)._M_dataplus._M_p = (pointer)&(this->m_owner).field_2;
  pcVar1 = (owner->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_owner,pcVar1,pcVar1 + owner->_M_string_length);
  (this->m_target)._M_dataplus._M_p = (pointer)&(this->m_target).field_2;
  pcVar1 = (target->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_target,pcVar1,pcVar1 + target->_M_string_length);
  this->m_side = side;
  this->m_type = type;
  this->m_price = price;
  this->m_quantity = quantity;
  this->m_openQuantity = quantity;
  this->m_executedQuantity = 0;
  this->m_avgExecutedPrice = 0.0;
  this->m_lastExecutedPrice = 0.0;
  this->m_lastExecutedQuantity = 0;
  return;
}

Assistant:

Order(
      const std::string &clientId,
      const std::string &symbol,
      const std::string &owner,
      const std::string &target,
      Side side,
      Type type,
      double price,
      long quantity)
      : m_clientId(clientId),
        m_symbol(symbol),
        m_owner(owner),
        m_target(target),
        m_side(side),
        m_type(type),
        m_price(price),
        m_quantity(quantity) {
    m_openQuantity = m_quantity;
    m_executedQuantity = 0;
    m_avgExecutedPrice = 0;
    m_lastExecutedPrice = 0;
    m_lastExecutedQuantity = 0;
  }